

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios_iotest.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  StepStatus SVar5;
  ulong uVar6;
  ostream *poVar7;
  element_type *peVar8;
  mapped_type *pmVar9;
  char *pcVar10;
  mapped_type *pmVar11;
  element_type *peVar12;
  rep rVar13;
  pointer ppVar14;
  size_type sVar15;
  element_type *peVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  exception *e_1;
  mapped_type reader_1;
  iterator readerIt;
  mapped_type writer_1;
  iterator writerIt;
  bool isWrite_1;
  string *streamName_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>
  *st_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
  *__range1_2;
  StepStatus status;
  mapped_type stream_1;
  iterator statusIt;
  CommandRead *cmdR_1;
  mapped_type stream;
  CommandWrite *cmdW_1;
  double t_3;
  time_point end_1;
  size_t i;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  end_2;
  size_t c;
  double *g;
  double *f;
  size_t N;
  double t_2;
  time_point start_1;
  CommandBusy *cmdS_1;
  double t_1;
  time_point end;
  double t;
  CommandSleep *cmdS;
  time_point start;
  shared_ptr<Command> *cmd_1;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_> *__range2;
  size_t step;
  bool exitLoop;
  shared_ptr<Stream> reader;
  string outputPath_1;
  iterator it_2;
  shared_ptr<Stream> writer;
  string outputPath;
  iterator it_1;
  bool isWrite;
  iterator it;
  mapped_type *groupName;
  shared_ptr<ioGroup> io;
  string streamName;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>
  *st;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
  *__range1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
  writeStreamMap;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
  readStreamMap;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>_>
  ioMap;
  CommandRead *cmdR;
  CommandWrite *cmdW;
  shared_ptr<Command> *cmd;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_> *__range1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
  streamsInOrder;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  groupMap;
  uint64_t actualBusyTime_usec;
  double timeEnd;
  double timeStart;
  invalid_argument *e;
  size_t currentConfigLineNumber;
  Config cfg;
  ADIOS adios;
  int threadSupportLevel;
  int provided;
  Settings settings;
  size_t *in_stack_00000df0;
  Settings *in_stack_00000df8;
  uint in_stack_fffffffffffff288;
  undefined4 in_stack_fffffffffffff28c;
  Settings *in_stack_fffffffffffff290;
  iterator in_stack_fffffffffffff298;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
  *in_stack_fffffffffffff2a0;
  key_type *in_stack_fffffffffffff2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2b8;
  duration<long,_std::ratio<1L,_1000000L>_> *in_stack_fffffffffffff2c0;
  key_type *in_stack_fffffffffffff2c8;
  Settings *in_stack_fffffffffffff2d0;
  undefined8 in_stack_fffffffffffff338;
  undefined4 in_stack_fffffffffffff340;
  undefined4 in_stack_fffffffffffff344;
  undefined8 in_stack_fffffffffffff348;
  shared_ptr<ioGroup> *in_stack_fffffffffffff350;
  string *in_stack_fffffffffffff358;
  Settings *in_stack_fffffffffffff360;
  size_t in_stack_fffffffffffff378;
  long local_c10;
  long local_bc8;
  long local_ae8;
  long local_ac8;
  _Self local_a20;
  _Self local_a18;
  _Base_ptr local_a10;
  _Base_ptr local_a08;
  _Self local_9f0;
  _Self local_9e8;
  undefined1 local_9d9;
  reference local_9d8;
  reference local_9d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>
  *local_9c8;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>_>
  local_9c0;
  undefined1 *local_9b8;
  StepStatus local_9ac;
  _Base_ptr local_998;
  undefined8 local_990;
  undefined8 local_978;
  duration<long,_std::ratio<1L,_1000000000L>_> local_970;
  double local_968;
  duration<long,_std::ratio<1L,_1000000000L>_> local_960;
  undefined8 local_958;
  ulong local_950;
  undefined8 local_948;
  duration<long,std::ratio<1l,1000000l>> local_940 [8];
  undefined8 local_938;
  duration local_930;
  ulong local_928;
  void *local_920;
  void *local_918;
  undefined8 local_910;
  double local_908;
  undefined8 local_900;
  long local_8f8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_8f0;
  double local_8e8;
  undefined8 local_8e0;
  duration<long,std::ratio<1l,1000000l>> local_8d8 [8];
  double local_8d0;
  long local_8c8;
  undefined8 local_8c0;
  __shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2> *local_8b8;
  shared_ptr<Command> *local_8b0;
  __normal_iterator<std::shared_ptr<Command>_*,_std::vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>_>
  local_8a8;
  undefined1 *local_8a0;
  string local_898 [32];
  string local_878 [32];
  string local_858 [32];
  ulong local_838;
  byte local_829;
  string local_808 [32];
  string local_7e8 [32];
  _Self local_7c8;
  _Self local_7c0 [5];
  string local_798 [32];
  string local_778 [32];
  _Self local_758;
  _Self local_750;
  undefined1 local_741;
  _Self local_730;
  _Self local_728;
  mapped_type *local_720;
  string local_708 [32];
  reference local_6e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>
  *local_6e0;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>_>
  local_6d8;
  undefined1 *local_6d0;
  undefined4 local_634;
  long local_608;
  undefined4 local_5fc;
  long local_5d0;
  __shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2> *local_5c8;
  shared_ptr<Command> *local_5c0;
  __normal_iterator<std::shared_ptr<Command>_*,_std::vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>_>
  local_5b8;
  undefined1 *local_5b0;
  undefined1 local_5a8 [72];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  long local_500;
  double local_4f8;
  double local_4f0;
  undefined8 local_400;
  ulong local_3f8 [19];
  undefined1 auStack_360 [72];
  ADIOS local_318 [16];
  ADIOS local_308 [16];
  ADIOS local_2f8 [16];
  undefined4 local_2e8;
  undefined1 local_2e4 [4];
  undefined4 local_2e0;
  undefined1 local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  int local_270;
  Settings *local_268;
  byte local_25f;
  byte local_25c;
  ompi_communicator_t *local_238;
  long local_230;
  undefined1 local_10 [8];
  undefined1 local_8 [4];
  int local_4;
  
  local_4 = 0;
  Settings::Settings(in_stack_fffffffffffff360);
  iVar4 = Settings::processArguments
                    (in_stack_fffffffffffff2d0,(int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),
                     (char **)in_stack_fffffffffffff2c0);
  if (iVar4 == 0) {
    local_2e8 = 0;
    if ((local_25c & 1) != 0) {
      local_2e8 = 3;
    }
    MPI_Init_thread(local_8,local_10,local_2e8,local_2e4);
    Settings::initDecomp(in_stack_fffffffffffff2d0,(MPI_Comm)in_stack_fffffffffffff2c8);
    iVar4 = Settings::extraArgumentChecks((Settings *)in_stack_fffffffffffff298._M_node);
    if (iVar4 == 0) {
      adios2::ADIOS::ADIOS(local_2f8);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        if ((local_230 == 0) && (local_270 != 0)) {
          poVar7 = std::operator<<((ostream *)&std::cout,"Use ADIOS xml file ");
          poVar7 = std::operator<<(poVar7,local_2b0);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        adios2::ADIOS::ADIOS(local_318,local_2b0,local_238);
        adios2::ADIOS::operator=
                  ((ADIOS *)in_stack_fffffffffffff290,
                   (ADIOS *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
        adios2::ADIOS::~ADIOS((ADIOS *)0x1392d8);
      }
      else {
        if ((local_230 == 0) && (local_270 != 0)) {
          poVar7 = std::operator<<((ostream *)&std::cout,"Use ADIOS without XML configuration ");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        adios2::ADIOS::ADIOS(local_308,local_238);
        adios2::ADIOS::operator=
                  ((ADIOS *)in_stack_fffffffffffff290,
                   (ADIOS *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
        adios2::ADIOS::~ADIOS((ADIOS *)0x139229);
      }
      Config::Config((Config *)in_stack_fffffffffffff290);
      local_400 = 0;
      processConfig(in_stack_00000df8,in_stack_00000df0);
      Config::operator=((Config *)in_stack_fffffffffffff290,
                        (Config *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
      Config::~Config((Config *)in_stack_fffffffffffff290);
      MPI_Barrier(local_238);
      local_4f0 = (double)MPI_Wtime();
      local_500 = 0;
      if ((local_230 == 0) && (local_270 != 0)) {
        std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff2c8);
        std::operator+((char *)in_stack_fffffffffffff298._M_node,
                       &in_stack_fffffffffffff290->configFileName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff298._M_node,(char *)in_stack_fffffffffffff290);
        poVar7 = std::operator<<((ostream *)&std::cout,local_520);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_520);
        std::__cxx11::string::~string(local_540);
        std::__cxx11::string::~string(local_560);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x139698);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                *)0x1396a5);
      local_5b0 = auStack_360;
      local_5b8._M_current =
           (shared_ptr<Command> *)
           std::vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>::begin
                     ((vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>
                       *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
      local_5c0 = (shared_ptr<Command> *)
                  std::vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>
                  ::end((vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>
                         *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::shared_ptr<Command>_*,_std::vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>_>
                                 *)in_stack_fffffffffffff290,
                                (__normal_iterator<std::shared_ptr<Command>_*,_std::vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288)),
            bVar3) {
        local_5c8 = &__gnu_cxx::
                     __normal_iterator<std::shared_ptr<Command>_*,_std::vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>_>
                     ::operator*(&local_5b8)->
                     super___shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>;
        peVar12 = std::__shared_ptr_access<Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x139725);
        if (peVar12->op == Write) {
          peVar8 = std::__shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>::get(local_5c8);
          if (peVar8 == (element_type *)0x0) {
            local_ac8 = 0;
          }
          else {
            local_ac8 = __dynamic_cast(peVar8,&Command::typeinfo,&CommandWrite::typeinfo,0);
          }
          local_5d0 = local_ac8;
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8);
          std::__cxx11::string::operator=((string *)pmVar9,(string *)(local_ac8 + 0x50));
          local_5fc = 2;
          std::make_pair<std::__cxx11::string_const&,Operation>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff298._M_node,(Operation *)in_stack_fffffffffffff290);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
          ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                       *)in_stack_fffffffffffff290,
                      (value_type *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>
                   *)0x13982a);
        }
        else {
          peVar12 = std::__shared_ptr_access<Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x13987b);
          if (peVar12->op == Read) {
            peVar8 = std::__shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>::get(local_5c8);
            if (peVar8 == (element_type *)0x0) {
              local_ae8 = 0;
            }
            else {
              local_ae8 = __dynamic_cast(peVar8,&Command::typeinfo,&CommandRead::typeinfo,0);
            }
            local_608 = local_ae8;
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8);
            std::__cxx11::string::operator=((string *)pmVar9,(string *)(local_ae8 + 0x58));
            local_634 = 3;
            std::make_pair<std::__cxx11::string_const&,Operation>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff298._M_node,(Operation *)in_stack_fffffffffffff290);
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
            ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                         *)in_stack_fffffffffffff290,
                        (value_type *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288))
            ;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>
                     *)0x139980);
          }
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<Command>_*,_std::vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>_>
        ::operator++(&local_5b8);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>_>
             *)0x1399cb);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
             *)0x1399d8);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
             *)0x1399e5);
      local_6d0 = local_5a8;
      local_6d8._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
              ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                       *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
      local_6e0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>
                   *)std::
                     vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                     ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                            *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>_>
                                 *)in_stack_fffffffffffff290,
                                (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288)),
            bVar3) {
        local_6e8 = __gnu_cxx::
                    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>_>
                    ::operator*(&local_6d8);
        std::__cxx11::string::string(local_708,(string *)local_6e8);
        std::shared_ptr<ioGroup>::shared_ptr((shared_ptr<ioGroup> *)0x139a76);
        local_720 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8);
        local_728._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),
                    (key_type *)0x139aba);
        local_730._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
        bVar3 = std::operator==(&local_728,&local_730);
        if (bVar3) {
          createGroup(in_stack_fffffffffffff2c8,(IOLib)((ulong)in_stack_fffffffffffff2c0 >> 0x20),
                      (ADIOS *)in_stack_fffffffffffff2b8);
          std::shared_ptr<ioGroup>::operator=
                    ((shared_ptr<ioGroup> *)in_stack_fffffffffffff290,
                     (shared_ptr<ioGroup> *)
                     CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
          std::shared_ptr<ioGroup>::~shared_ptr((shared_ptr<ioGroup> *)0x139b57);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>_>
          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>_>
                        *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8);
          std::shared_ptr<ioGroup>::operator=
                    ((shared_ptr<ioGroup> *)in_stack_fffffffffffff290,
                     (shared_ptr<ioGroup> *)
                     CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
        }
        else {
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>
          ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>
                        *)0x139bcc);
          std::shared_ptr<ioGroup>::operator=
                    ((shared_ptr<ioGroup> *)in_stack_fffffffffffff290,
                     (shared_ptr<ioGroup> *)
                     CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
        }
        local_741 = local_6e8->second == Write;
        if ((bool)local_741) {
          local_750._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),
                      (key_type *)0x139c1b);
          local_758._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
          bVar3 = std::operator==(&local_750,&local_758);
          if (bVar3) {
            if ((local_230 == 0) && (local_270 != 0)) {
              poVar7 = std::operator<<((ostream *)&std::cout,"    Create Output Stream ");
              poVar7 = std::operator<<(poVar7,local_708);
              poVar7 = std::operator<<(poVar7,"... ");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            }
            uVar6 = std::__cxx11::string::empty();
            if ((uVar6 & 1) == 0) {
              std::__cxx11::string::string(local_778,local_290);
              pcVar10 = (char *)std::__cxx11::string::back();
              if (*pcVar10 != '/') {
                std::__cxx11::string::operator+=(local_778,'/');
              }
              std::operator+(in_stack_fffffffffffff2b8,in_stack_fffffffffffff2b0);
              std::__cxx11::string::operator=(local_708,local_798);
              std::__cxx11::string::~string(local_798);
              std::__cxx11::string::~string(local_778);
            }
            std::shared_ptr<ioGroup>::shared_ptr
                      ((shared_ptr<ioGroup> *)in_stack_fffffffffffff290,
                       (shared_ptr<ioGroup> *)
                       CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
            in_stack_fffffffffffff288 = local_25f & 1;
            in_stack_fffffffffffff290 = local_268;
            openStream(in_stack_fffffffffffff358,in_stack_fffffffffffff350,
                       (Mode)((ulong)in_stack_fffffffffffff348 >> 0x20),
                       (IOLib)in_stack_fffffffffffff348,
                       (MPI_Comm)CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340),
                       SUB81((ulong)in_stack_fffffffffffff338 >> 0x38,0),in_stack_fffffffffffff378);
            std::shared_ptr<ioGroup>::~shared_ptr((shared_ptr<ioGroup> *)0x139e3c);
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                          *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8);
            std::shared_ptr<Stream>::operator=
                      ((shared_ptr<Stream> *)in_stack_fffffffffffff290,
                       (shared_ptr<Stream> *)
                       CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
            std::shared_ptr<Stream>::~shared_ptr((shared_ptr<Stream> *)0x139e7d);
          }
        }
        else {
          local_7c0[0]._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),
                      (key_type *)0x139ee5);
          local_7c8._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
          bVar3 = std::operator==(local_7c0,&local_7c8);
          if (bVar3) {
            poVar7 = std::operator<<((ostream *)&std::cout,"    Open Input Stream ");
            poVar7 = std::operator<<(poVar7,local_708);
            poVar7 = std::operator<<(poVar7,"... ");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            uVar6 = std::__cxx11::string::empty();
            if ((uVar6 & 1) == 0) {
              std::__cxx11::string::string(local_7e8,local_290);
              pcVar10 = (char *)std::__cxx11::string::back();
              if (*pcVar10 != '/') {
                std::__cxx11::string::operator+=(local_7e8,'/');
              }
              std::operator+(in_stack_fffffffffffff2b8,in_stack_fffffffffffff2b0);
              std::__cxx11::string::operator=(local_708,local_808);
              std::__cxx11::string::~string(local_808);
              std::__cxx11::string::~string(local_7e8);
            }
            std::shared_ptr<ioGroup>::shared_ptr
                      ((shared_ptr<ioGroup> *)in_stack_fffffffffffff290,
                       (shared_ptr<ioGroup> *)
                       CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
            in_stack_fffffffffffff288 = local_25f & 1;
            in_stack_fffffffffffff290 = local_268;
            openStream(in_stack_fffffffffffff358,in_stack_fffffffffffff350,
                       (Mode)((ulong)in_stack_fffffffffffff348 >> 0x20),
                       (IOLib)in_stack_fffffffffffff348,
                       (MPI_Comm)CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340),
                       SUB81((ulong)in_stack_fffffffffffff338 >> 0x38,0),in_stack_fffffffffffff378);
            std::shared_ptr<ioGroup>::~shared_ptr((shared_ptr<ioGroup> *)0x13a0ef);
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                          *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8);
            std::shared_ptr<Stream>::operator=
                      ((shared_ptr<Stream> *)in_stack_fffffffffffff290,
                       (shared_ptr<Stream> *)
                       CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
            std::shared_ptr<Stream>::~shared_ptr((shared_ptr<Stream> *)0x13a130);
          }
        }
        std::shared_ptr<ioGroup>::~shared_ptr((shared_ptr<ioGroup> *)0x13a187);
        std::__cxx11::string::~string(local_708);
        __gnu_cxx::
        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>_>
        ::operator++(&local_6d8);
      }
      local_829 = 0;
      local_838 = 1;
      while (((local_829 ^ 0xff) & 1) != 0) {
        if (local_230 == 0) {
          std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff2c8);
          std::operator+((char *)in_stack_fffffffffffff298._M_node,
                         &in_stack_fffffffffffff290->configFileName);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff298._M_node,(char *)in_stack_fffffffffffff290);
          poVar7 = std::operator<<((ostream *)&std::cout,local_858);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_838);
          poVar7 = std::operator<<(poVar7,": ");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_858);
          std::__cxx11::string::~string(local_878);
          std::__cxx11::string::~string(local_898);
        }
        local_8a0 = auStack_360;
        local_8a8._M_current =
             (shared_ptr<Command> *)
             std::vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>::
             begin((vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_> *)
                   CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
        local_8b0 = (shared_ptr<Command> *)
                    std::
                    vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>::
                    end((vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>
                         *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
        while (bVar3 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::shared_ptr<Command>_*,_std::vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>_>
                                   *)in_stack_fffffffffffff290,
                                  (__normal_iterator<std::shared_ptr<Command>_*,_std::vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288)),
              bVar3) {
          local_8b8 = &__gnu_cxx::
                       __normal_iterator<std::shared_ptr<Command>_*,_std::vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>_>
                       ::operator*(&local_8a8)->
                       super___shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>;
          std::__shared_ptr_access<Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Command,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x13a3d3);
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            std::__shared_ptr_access<Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Command,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x13a404);
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>_>
                      ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>_>
                            *)in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8);
            if (*pmVar11 == OK) goto LAB_0013a4a9;
            if ((local_230 == 0) && (local_270 != 0)) {
              poVar7 = std::operator<<((ostream *)&std::cout,
                                       "    Skip command because of status of stream ");
              peVar12 = std::__shared_ptr_access<Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x13a46e);
              poVar7 = std::operator<<(poVar7,(string *)&peVar12->conditionalStream);
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            }
          }
          else {
LAB_0013a4a9:
            peVar12 = std::__shared_ptr_access<Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x13a4b6);
            switch(peVar12->op) {
            case Sleep:
              local_8c0 = std::chrono::_V2::system_clock::now();
              adios2::ADIOS::EnterComputationBlock();
              peVar8 = std::__shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>::get(local_8b8);
              if (peVar8 == (element_type *)0x0) {
                local_bc8 = 0;
              }
              else {
                local_bc8 = __dynamic_cast(peVar8,&Command::typeinfo,&CommandSleep::typeinfo,0);
              }
              local_8c8 = local_bc8;
              if ((local_230 == 0) && (local_270 != 0)) {
                uVar1 = *(undefined8 *)(local_bc8 + 0x30);
                auVar17._8_4_ = (int)((ulong)uVar1 >> 0x20);
                auVar17._0_8_ = uVar1;
                auVar17._12_4_ = 0x45300000;
                local_8d0 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                            1000000.0;
                poVar7 = std::operator<<((ostream *)&std::cout,"    Sleep for ");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_8d0);
                std::operator<<(poVar7,"  seconds ");
              }
              std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<unsigned_long,void>
                        (local_8d8,(unsigned_long *)(local_8c8 + 0x30));
              std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(in_stack_fffffffffffff2c0);
              adios2::ADIOS::ExitComputationBlock();
              if ((local_230 == 0) && (local_270 != 0)) {
                local_8e0 = std::chrono::_V2::system_clock::now();
                local_8f0.__r =
                     (rep)std::chrono::operator-
                                    ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)in_stack_fffffffffffff298._M_node,
                                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)in_stack_fffffffffffff290);
                rVar13 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                                   (&local_8f0);
                local_8e8 = (double)rVar13 / 1000000000.0;
                poVar7 = std::operator<<((ostream *)&std::cout," -> Slept for ");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_8e8);
                poVar7 = std::operator<<(poVar7,"  seconds ");
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              }
              break;
            case Busy:
              peVar8 = std::__shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>::get(local_8b8);
              if (peVar8 == (element_type *)0x0) {
                local_c10 = 0;
              }
              else {
                local_c10 = __dynamic_cast(peVar8,&Command::typeinfo,&CommandBusy::typeinfo,0);
              }
              local_8f8 = local_c10;
              local_900 = std::chrono::_V2::system_clock::now();
              if ((local_230 == 0) && (local_270 != 0)) {
                uVar1 = *(undefined8 *)(local_8f8 + 0x38);
                auVar18._8_4_ = (int)((ulong)uVar1 >> 0x20);
                auVar18._0_8_ = uVar1;
                auVar18._12_4_ = 0x45300000;
                local_908 = ((auVar18._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                            1000000.0;
                poVar7 = std::operator<<((ostream *)&std::cout,"    Busy for ");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(ulong *)(local_8f8 + 0x30));
                poVar7 = std::operator<<(poVar7," cycles with ");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_908);
                std::operator<<(poVar7," seconds work in each cycle");
              }
              local_910 = 0x100000;
              local_918 = calloc(0x100000,8);
              local_920 = malloc(0x800000);
              for (local_928 = 0; local_928 < *(ulong *)(local_8f8 + 0x30);
                  local_928 = local_928 + 1) {
                local_938 = std::chrono::_V2::system_clock::now();
                std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<unsigned_long,void>
                          (local_940,(unsigned_long *)(local_8f8 + 0x38));
                local_930.__r =
                     (rep)std::chrono::operator+
                                    ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)in_stack_fffffffffffff298._M_node,
                                     (duration<long,_std::ratio<1L,_1000000L>_> *)
                                     in_stack_fffffffffffff290);
                uVar1 = *(undefined8 *)(local_8f8 + 0x38);
                auVar19._8_4_ = (int)((ulong)uVar1 >> 0x20);
                auVar19._0_8_ = uVar1;
                auVar19._12_4_ = 0x45300000;
                if (0.1 < (auVar19._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) {
                  adios2::ADIOS::EnterComputationBlock();
                }
                while( true ) {
                  local_948 = std::chrono::_V2::system_clock::now();
                  bVar3 = std::chrono::operator<
                                    ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)in_stack_fffffffffffff2a0,
                                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)in_stack_fffffffffffff298._M_node);
                  if (!bVar3) break;
                  for (local_950 = 0; local_950 < 0x100000; local_950 = local_950 + 1) {
                    dVar2 = *(double *)((long)local_918 + local_950 * 8);
                    *(double *)((long)local_918 + local_950 * 8) = dVar2 + dVar2 + 1e-06;
                  }
                }
                uVar1 = *(undefined8 *)(local_8f8 + 0x38);
                auVar20._8_4_ = (int)((ulong)uVar1 >> 0x20);
                auVar20._0_8_ = uVar1;
                auVar20._12_4_ = 0x45300000;
                if (0.1 < (auVar20._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) {
                  adios2::ADIOS::ExitComputationBlock();
                }
                MPI_Allreduce(local_918,local_920,0x100000,&ompi_mpi_double,&ompi_mpi_op_sum,
                              local_238);
              }
              local_958 = std::chrono::_V2::system_clock::now();
              local_960.__r =
                   (rep)std::chrono::operator-
                                  ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)in_stack_fffffffffffff298._M_node,
                                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)in_stack_fffffffffffff290);
              rVar13 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_960);
              local_500 = rVar13 / 1000 + local_500;
              if ((local_230 == 0) && (local_270 != 0)) {
                local_970.__r =
                     (rep)std::chrono::operator-
                                    ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)in_stack_fffffffffffff298._M_node,
                                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)in_stack_fffffffffffff290);
                rVar13 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                                   (&local_970);
                local_968 = (double)rVar13 / 1000000000.0;
                poVar7 = std::operator<<((ostream *)&std::cout," -> Was busy for ");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_968);
                poVar7 = std::operator<<(poVar7,"  seconds ");
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              }
              break;
            case Write:
              peVar8 = std::__shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>::get(local_8b8);
              if (peVar8 == (element_type *)0x0) {
                local_978 = 0;
              }
              else {
                local_978 = __dynamic_cast(peVar8,&Command::typeinfo,&CommandWrite::typeinfo,0);
              }
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                            *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8);
              std::shared_ptr<Stream>::shared_ptr
                        ((shared_ptr<Stream> *)in_stack_fffffffffffff290,
                         (shared_ptr<Stream> *)
                         CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
              peVar16 = std::__shared_ptr_access<Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                        operator->((__shared_ptr_access<Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x13ad13);
              (*peVar16->_vptr_Stream[2])(peVar16,local_978,local_3f8,local_2d0,local_838);
              local_2e0 = 10;
              std::shared_ptr<Stream>::~shared_ptr((shared_ptr<Stream> *)0x13ad59);
              break;
            case Read:
              peVar8 = std::__shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>::get(local_8b8);
              if (peVar8 == (element_type *)0x0) {
                local_990 = 0;
              }
              else {
                local_990 = __dynamic_cast(peVar8,&Command::typeinfo,&CommandRead::typeinfo,0);
              }
              local_998 = (_Base_ptr)
                          std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>_>
                          ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),
                                 (key_type *)0x13adfd);
              ppVar14 = std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>
                        ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>
                                      *)0x13ae24);
              if ((ppVar14->second == OK) ||
                 (ppVar14 = std::
                            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>
                            ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>
                                          *)0x13ae37), ppVar14->second == NotReady)) {
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                              *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8);
                std::shared_ptr<Stream>::shared_ptr
                          ((shared_ptr<Stream> *)in_stack_fffffffffffff290,
                           (shared_ptr<Stream> *)
                           CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
                peVar16 = std::__shared_ptr_access<Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x13ae8e);
                SVar5 = (*peVar16->_vptr_Stream[3])(peVar16,local_990,local_3f8,local_2d0,local_838)
                ;
                local_9ac = SVar5;
                ppVar14 = std::
                          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>
                          ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>
                                        *)0x13aeec);
                ppVar14->second = SVar5;
                if (local_9ac != OK) {
                  if (local_9ac == NotReady) {
                    if ((local_230 == 0) && (local_270 != 0)) {
                      poVar7 = std::operator<<((ostream *)&std::cout,
                                               "    Nonblocking read status: Not Ready ");
                      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                    }
                  }
                  else if (((local_9ac - EndOfStream < 2) &&
                           (std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                            ::erase((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                                     *)in_stack_fffffffffffff290,
                                    (key_type *)
                                    CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288)),
                           local_230 == 0)) && (local_270 != 0)) {
                    poVar7 = std::operator<<((ostream *)&std::cout,
                                             "    Nonblocking read status: Terminated ");
                    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  }
                }
                std::shared_ptr<Stream>::~shared_ptr((shared_ptr<Stream> *)0x13b017);
              }
            }
            if ((local_230 == 0) && (local_270 != 0)) {
              std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>)
              ;
            }
          }
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<Command>_*,_std::vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>_>
          ::operator++(&local_8a8);
        }
        sVar15 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                         *)0x13b06a);
        if ((sVar15 == 0) && (local_3f8[0] <= local_838)) {
          local_829 = 1;
        }
        local_838 = local_838 + 1;
      }
      local_9b8 = local_5a8;
      local_9c0._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
              ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                       *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
      local_9c8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>
                   *)std::
                     vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                     ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                            *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>_>
                                 *)in_stack_fffffffffffff290,
                                (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288)),
            bVar3) {
        local_9d8 = __gnu_cxx::
                    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>_>
                    ::operator*(&local_9c0);
        local_9d9 = local_9d8->second == Write;
        local_9d0 = local_9d8;
        if ((bool)local_9d9) {
          local_9e8._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),
                      (key_type *)0x13b15b);
          local_9f0._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
          bVar3 = std::operator!=(&local_9e8,&local_9f0);
          if (bVar3) {
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                          *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8);
            std::shared_ptr<Stream>::shared_ptr
                      ((shared_ptr<Stream> *)in_stack_fffffffffffff290,
                       (shared_ptr<Stream> *)
                       CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>
            ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>
                          *)0x13b1e9);
            peVar16 = std::__shared_ptr_access<Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x13b1f5);
            (*peVar16->_vptr_Stream[4])();
            local_a08 = local_9e8._M_node;
            local_a10 = (_Base_ptr)
                        std::
                        map<std::__cxx11::string,std::shared_ptr<Stream>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Stream>>>>
                        ::erase_abi_cxx11_((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                                            *)in_stack_fffffffffffff290,in_stack_fffffffffffff298);
            std::shared_ptr<Stream>::~shared_ptr((shared_ptr<Stream> *)0x13b24f);
          }
        }
        else {
          local_a18._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),
                      (key_type *)0x13b291);
          local_a20._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
          bVar3 = std::operator!=(&local_a18,&local_a20);
          if (bVar3) {
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                          *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8);
            std::shared_ptr<Stream>::shared_ptr
                      ((shared_ptr<Stream> *)in_stack_fffffffffffff290,
                       (shared_ptr<Stream> *)
                       CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>
            ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>
                          *)0x13b313);
            peVar16 = std::__shared_ptr_access<Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x13b31f);
            (*peVar16->_vptr_Stream[4])();
            std::
            map<std::__cxx11::string,std::shared_ptr<Stream>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Stream>>>>
            ::erase_abi_cxx11_((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                                *)in_stack_fffffffffffff290,in_stack_fffffffffffff298);
            std::shared_ptr<Stream>::~shared_ptr((shared_ptr<Stream> *)0x13b373);
          }
        }
        __gnu_cxx::
        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>_>
        ::operator++(&local_9c0);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
              *)0x13b3bb);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
              *)0x13b3c8);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>_>
              *)0x13b3d5);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
      ::~vector(in_stack_fffffffffffff2a0);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x13b3ef);
      MPI_Barrier(local_238);
      local_4f8 = (double)MPI_Wtime();
      if (local_230 == 0) {
        if (local_500 != 0) {
          poVar7 = std::operator<<((ostream *)&std::cout,"  Total Busy time on Rank 0 was ");
          auVar21._8_4_ = (int)((ulong)local_500 >> 0x20);
          auVar21._0_8_ = local_500;
          auVar21._12_4_ = 0x45300000;
          poVar7 = (ostream *)
                   std::ostream::operator<<
                             (poVar7,((auVar21._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)local_500) -
                                     4503599627370496.0)) / 1000000.0);
          poVar7 = std::operator<<(poVar7," seconds ");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        poVar7 = std::operator<<((ostream *)&std::cout,"ADIOS IOTEST App ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,(ulong)local_268);
        poVar7 = std::operator<<(poVar7," total time ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_4f8 - local_4f0);
        poVar7 = std::operator<<(poVar7," seconds ");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      MPI_Finalize();
      local_4 = 0;
      local_2e0 = 1;
      Config::~Config((Config *)in_stack_fffffffffffff290);
      adios2::ADIOS::~ADIOS((ADIOS *)0x13b6ab);
    }
    else {
      local_4 = 1;
      local_2e0 = 1;
    }
  }
  else {
    local_4 = 1;
    local_2e0 = 1;
  }
  Settings::~Settings(in_stack_fffffffffffff290);
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{
    Settings settings;

    /* Check input arguments. Quit if something is wrong. */
    if (settings.processArguments(argc, argv))
    {
        return 1;
    }

    int provided;
    int threadSupportLevel = MPI_THREAD_SINGLE;
    if (settings.multithreadedMPI)
    {
        threadSupportLevel = MPI_THREAD_MULTIPLE;
    }
    MPI_Init_thread(&argc, &argv, threadSupportLevel, &provided);

    settings.initDecomp(MPI_COMM_WORLD);

    // MPI-dependent argument checks
    if (settings.extraArgumentChecks())
    {
        return 1;
    }

    adios2::ADIOS adios;
    if (settings.adiosConfigFileName.empty())
    {
        if (!settings.myRank && settings.verbose)
        {
            std::cout << "Use ADIOS without XML configuration " << std::endl;
        }
        adios = adios2::ADIOS(settings.appComm);
    }
    else
    {
        if (!settings.myRank && settings.verbose)
        {
            std::cout << "Use ADIOS xml file " << settings.adiosConfigFileName << std::endl;
        }
        adios = adios2::ADIOS(settings.adiosConfigFileName, settings.appComm);
    }
    Config cfg;
    size_t currentConfigLineNumber = 0;

    try
    {
        cfg = processConfig(settings, &currentConfigLineNumber);
    }
    catch (std::invalid_argument &e) // config file processing errors
    {
        if (!settings.myRank)
        {
            if (!currentConfigLineNumber)
            {
                std::cout << "Config file error: " << e.what() << std::endl;
            }
            else
            {
                std::cout << "Config file error in line " << currentConfigLineNumber << ": "
                          << e.what() << std::endl;
            }
        }

        /* Quit calmly */
        MPI_Finalize();
        return 1;
    }

    double timeStart, timeEnd;
    MPI_Barrier(settings.appComm);
    timeStart = MPI_Wtime();

    uint64_t actualBusyTime_usec = 0;

    try
    {
        /* writing to one stream using two groups is not supported.
         * FIXME: we need to check for this condition and raise error
         */
        if (!settings.myRank && settings.verbose)
        {
            std::cout << "Start App " + std::to_string(settings.appId) + ": " << std::endl;
        }
        /* 1. Assign stream names with group names that appear in
           commands */
        // map of <streamName, groupName>
        std::map<std::string, std::string> groupMap;
        // a vector of streams in the order they appear
        std::vector<std::pair<std::string, Operation>> streamsInOrder;
        for (const auto &cmd : cfg.commands)
        {
            if (cmd->op == Operation::Write)
            {
                auto cmdW = dynamic_cast<CommandWrite *>(cmd.get());
                groupMap[cmdW->streamName] = cmdW->groupName;
                streamsInOrder.push_back(std::make_pair(cmdW->streamName, Operation::Write));
            }
            else if (cmd->op == Operation::Read)
            {
                auto cmdR = dynamic_cast<CommandRead *>(cmd.get());
                groupMap[cmdR->streamName] = cmdR->groupName;
                streamsInOrder.push_back(std::make_pair(cmdR->streamName, Operation::Read));
            }
        }

        std::map<std::string, std::shared_ptr<ioGroup>> ioMap;

        /* 2. Declare/define groups and open streams in the order they
         * appear */
        std::map<std::string, std::shared_ptr<Stream>> readStreamMap;
        std::map<std::string, std::shared_ptr<Stream>> writeStreamMap;

        for (const auto &st : streamsInOrder)
        {
            std::string streamName = st.first;
            std::shared_ptr<ioGroup> io;
            auto &groupName = groupMap[streamName];
            auto it = ioMap.find(groupName);
            if (it == ioMap.end())
            {
                io = createGroup(groupName, settings.iolib, adios);
                ioMap[groupName] = io;
            }
            else
            {
                io = it->second;
            }
            const bool isWrite = (st.second == Operation::Write);
            if (isWrite)
            {
                auto it = writeStreamMap.find(streamName);
                if (it == writeStreamMap.end())
                {
                    if (!settings.myRank && settings.verbose)
                    {
                        std::cout << "    Create Output Stream " << streamName << "... "
                                  << std::endl;
                    }
                    if (!settings.outputPath.empty())
                    {
                        std::string outputPath = settings.outputPath;
                        if (settings.outputPath.back() != '/')
                        {
                            outputPath += '/';
                        }

                        streamName = outputPath + streamName;
                    }
                    std::shared_ptr<Stream> writer =
                        openStream(streamName, io, adios2::Mode::Write, settings.iolib,
                                   settings.appComm, settings.ioTimer, settings.appId);
                    writeStreamMap[st.first] = writer;
                }
            }
            else /* Read */
            {
                auto it = readStreamMap.find(streamName);
                if (it == readStreamMap.end())
                {
                    std::cout << "    Open Input Stream " << streamName << "... " << std::endl;
                    if (!settings.outputPath.empty())
                    {
                        std::string outputPath = settings.outputPath;
                        if (settings.outputPath.back() != '/')
                        {
                            outputPath += '/';
                        }

                        streamName = outputPath + streamName;
                    }
                    std::shared_ptr<Stream> reader =
                        openStream(streamName, io, adios2::Mode::Read, settings.iolib,
                                   settings.appComm, settings.ioTimer, settings.appId);
                    readStreamMap[st.first] = reader;
                }
            }
        }

        /* Execute commands */
        bool exitLoop = false;
        size_t step = 1;
        while (!exitLoop)
        {
            if (!settings.myRank)
            {
                std::cout << "App " + std::to_string(settings.appId) + " Step " << step << ": "
                          << std::endl;
            }
            for (const auto &cmd : cfg.commands)
            {
                if (!cmd->conditionalStream.empty() &&
                    cfg.condMap.at(cmd->conditionalStream) != adios2::StepStatus::OK)
                {
                    if (!settings.myRank && settings.verbose)
                    {
                        std::cout << "    Skip command because of status "
                                     "of stream "
                                  << cmd->conditionalStream << std::endl;
                    }
                    continue;
                }

                switch (cmd->op)
                {
                case Operation::Sleep: {
                    std::chrono::high_resolution_clock::time_point start =
                        std::chrono::high_resolution_clock::now();
                    adios.EnterComputationBlock();
                    auto cmdS = dynamic_cast<const CommandSleep *>(cmd.get());
                    if (!settings.myRank && settings.verbose)
                    {
                        double t = static_cast<double>(cmdS->sleepTime_us) / 1000000.0;
                        std::cout << "    Sleep for " << t << "  seconds ";
                    }
                    std::this_thread::sleep_for(std::chrono::microseconds(cmdS->sleepTime_us));
                    adios.ExitComputationBlock();
                    if (!settings.myRank && settings.verbose)
                    {
                        std::chrono::high_resolution_clock::time_point end =
                            std::chrono::high_resolution_clock::now();
                        double t = static_cast<double>((end - start).count()) / 1000000000.0;
                        std::cout << " -> Slept for " << t << "  seconds " << std::endl;
                    }
                    break;
                }
                case Operation::Busy: {
                    auto cmdS = dynamic_cast<const CommandBusy *>(cmd.get());
                    std::chrono::high_resolution_clock::time_point start =
                        std::chrono::high_resolution_clock::now();
                    // auto sleeptime =
                    //     std::chrono::microseconds(cmdS->busyTime_us);
                    if (!settings.myRank && settings.verbose)
                    {
                        double t = static_cast<double>(cmdS->busyTime_us) / 1000000.0;
                        std::cout << "    Busy for " << cmdS->cycles << " cycles with " << t
                                  << " seconds work in each cycle";
                    }
                    const size_t N = 1048576;
                    double *f = (double *)calloc(N, sizeof(double));
                    double *g = (double *)malloc(N * sizeof(double));
                    for (size_t c = 0; c < cmdS->cycles; ++c)
                    {
                        auto end = std::chrono::high_resolution_clock::now() +
                                   std::chrono::microseconds(cmdS->busyTime_us);
                        if (cmdS->busyTime_us > 0.1)
                        {
                            adios.EnterComputationBlock();
                        }
                        while (std::chrono::high_resolution_clock::now() < end)
                        {
                            for (size_t i = 0; i < N; ++i)
                            {
                                f[i] = f[i] * 2.0 + 0.000001;
                            }
                        }
                        if (cmdS->busyTime_us > 0.1)
                        {
                            adios.ExitComputationBlock();
                        }
                        MPI_Allreduce(f, g, N, MPI_DOUBLE, MPI_SUM, settings.appComm);
                    }
                    std::chrono::high_resolution_clock::time_point end =
                        std::chrono::high_resolution_clock::now();
                    actualBusyTime_usec += (end - start).count() / 1000;
                    if (!settings.myRank && settings.verbose)
                    {
                        double t = static_cast<double>((end - start).count()) / 1000000000.0;
                        std::cout << " -> Was busy for " << t << "  seconds " << std::endl;
                    }
                    break;
                }
                case Operation::Write: {
                    auto cmdW = dynamic_cast<CommandWrite *>(cmd.get());
                    auto stream = writeStreamMap[cmdW->streamName];
                    // auto io = ioMap[cmdW->groupName];
                    stream->Write(cmdW, cfg, settings, step);
                    break;
                }
                case Operation::Read: {
                    auto cmdR = dynamic_cast<CommandRead *>(cmd.get());
                    auto statusIt = cfg.condMap.find(cmdR->streamName);
                    if (statusIt->second == adios2::StepStatus::OK ||
                        statusIt->second == adios2::StepStatus::NotReady)
                    {
                        auto stream = readStreamMap[cmdR->streamName];
                        // auto io = ioMap[cmdR->groupName];
                        adios2::StepStatus status = stream->Read(cmdR, cfg, settings, step);
                        statusIt->second = status;
                        switch (status)
                        {
                        case adios2::StepStatus::OK:
                            break;
                        case adios2::StepStatus::NotReady:
                            if (!settings.myRank && settings.verbose)
                            {
                                std::cout << "    Nonblocking read status: "
                                             "Not Ready "
                                          << std::endl;
                            }
                            break;
                        case adios2::StepStatus::EndOfStream:
                        case adios2::StepStatus::OtherError:
                            cfg.stepOverStreams.erase(cmdR->streamName);
                            if (!settings.myRank && settings.verbose)
                            {
                                std::cout << "    Nonblocking read status: "
                                             "Terminated "
                                          << std::endl;
                            }
                            break;
                        }
                    }
                    break;
                }
                }
                if (!settings.myRank && settings.verbose)
                {
                    std::cout << std::endl;
                }
            }
            if (!cfg.stepOverStreams.size() && step >= cfg.nSteps)
            {
                exitLoop = true;
            }
            ++step;
        }

        /* Close all streams in order of opening */
        for (const auto &st : streamsInOrder)
        {
            const std::string &streamName = st.first;
            const bool isWrite = (st.second == Operation::Write);
            if (isWrite)
            {
                auto writerIt = writeStreamMap.find(streamName);
                if (writerIt != writeStreamMap.end())
                {
                    auto writer = writeStreamMap[streamName];
                    writerIt->second->Close();
                    writeStreamMap.erase(writerIt);
                }
            }
            else /* Read */
            {
                auto readerIt = readStreamMap.find(streamName);
                if (readerIt != readStreamMap.end())
                {
                    auto reader = readStreamMap[streamName];
                    readerIt->second->Close();
                    readStreamMap.erase(readerIt);
                }
            }
        }
    }
    catch (std::exception &e) // if some unknown error occurs
    {
        if (!settings.myRank)
        {
            std::cout << "ADIOS " << e.what() << std::endl;
        }

        /* Yell and quit */
        MPI_Abort(settings.appComm, -1);
    }

    MPI_Barrier(settings.appComm);
    timeEnd = MPI_Wtime();
    if (!settings.myRank)
    {
        if (actualBusyTime_usec > 0)
        {
            std::cout << "  Total Busy time on Rank 0 was "
                      << (double)actualBusyTime_usec / 1000000.0 << " seconds " << std::endl;
        }
        std::cout << "ADIOS IOTEST App " << settings.appId << " total time " << timeEnd - timeStart
                  << " seconds " << std::endl;
    }

    MPI_Finalize();
    return 0;
}